

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O3

void tcu::computePixelScaleBias(ConstPixelBufferAccess *access,Vec4 *scale,Vec4 *bias)

{
  float fVar1;
  long lVar2;
  float *pfVar3;
  float fVar4;
  Vec4 maxVal;
  Vec4 minVal;
  Vec4 local_38;
  Vec4 local_28;
  
  local_28.m_data[0] = 0.0;
  local_28.m_data[1] = 0.0;
  local_28.m_data[2] = 0.0;
  local_28.m_data[3] = 0.0;
  local_38.m_data[0] = 0.0;
  local_38.m_data[1] = 0.0;
  local_38.m_data[2] = 0.0;
  local_38.m_data[3] = 0.0;
  estimatePixelValueRange(access,&local_28,&local_38);
  lVar2 = 0;
  do {
    fVar4 = *(float *)((long)local_38.m_data + lVar2);
    fVar1 = *(float *)((long)local_28.m_data + lVar2);
    if (0.0001 <= fVar4 - fVar1) {
      fVar4 = 1.0 / (fVar4 - fVar1);
      *(float *)((long)scale->m_data + lVar2) = fVar4;
      *(float *)((long)bias->m_data + lVar2) = 0.0 - fVar1 * fVar4;
    }
    else {
      fVar4 = (float)(~-(uint)(fVar4 < 0.0001) & (uint)(1.0 / fVar4) |
                     -(uint)(fVar4 < 0.0001) & 0x3f800000);
      *(float *)((long)scale->m_data + lVar2) = fVar4;
      if (lVar2 == 0xc) {
        fVar4 = scale->m_data[3] * -local_38.m_data[3] + 1.0;
        pfVar3 = bias->m_data + 3;
      }
      else {
        fVar4 = 0.0 - fVar1 * fVar4;
        pfVar3 = (float *)((long)bias->m_data + lVar2);
      }
      *pfVar3 = fVar4;
    }
    lVar2 = lVar2 + 4;
  } while (lVar2 != 0x10);
  return;
}

Assistant:

void computePixelScaleBias (const ConstPixelBufferAccess& access, Vec4& scale, Vec4& bias)
{
	Vec4 minVal, maxVal;
	estimatePixelValueRange(access, minVal, maxVal);

	const float eps = 0.0001f;

	for (int c = 0; c < 4; c++)
	{
		if (maxVal[c] - minVal[c] < eps)
		{
			scale[c]	= (maxVal[c] < eps) ? 1.0f : (1.0f / maxVal[c]);
			bias[c]		= (c == 3) ? (1.0f - maxVal[c]*scale[c]) : (0.0f - minVal[c]*scale[c]);
		}
		else
		{
			scale[c]	= 1.0f / (maxVal[c] - minVal[c]);
			bias[c]		= 0.0f - minVal[c]*scale[c];
		}
	}
}